

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O2

void __thiscall Atari::ST::ConcreteMachine::set_component_prefers_clocking(ConcreteMachine *this)

{
  Preference in_EDX;
  Source *in_RSI;
  
  set_component_prefers_clocking((ConcreteMachine *)(this[-1].memory_map_ + 0xc9),in_RSI,in_EDX);
  return;
}

Assistant:

void set_component_prefers_clocking(ClockingHint::Source *, ClockingHint::Preference) final {
			// This is being called by one of the components; avoid any time flushing here as that's
			// already dealt with (and, just to be absolutely sure, to avoid recursive mania).
			may_defer_acias_ =
				(keyboard_acia_.last_valid()->preferred_clocking() != ClockingHint::Preference::RealTime) &&
				(midi_acia_.last_valid()->preferred_clocking() != ClockingHint::Preference::RealTime);
			keyboard_needs_clock_ = ikbd_.preferred_clocking() != ClockingHint::Preference::None;
			mfp_is_realtime_ = mfp_.last_valid()->preferred_clocking() == ClockingHint::Preference::RealTime;
			dma_clocking_preference_ = dma_.last_valid()->preferred_clocking();
		}